

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void __thiscall f8n::db::Statement::Statement(Statement *this,char *sql,Connection *connection)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  this->_vptr_Statement = (_func_int **)&PTR__Statement_00215438;
  this->stmt = (sqlite3_stmt *)0x0;
  this->connection = connection;
  this->modifiedRows = 0;
  local_30._M_device = &connection->mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  sqlite3_prepare_v2(this->connection->connection,sql,-1,&this->stmt,(char **)0x0);
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

Statement::Statement(const char* sql, Connection &connection)
: connection(&connection)
, stmt(nullptr)
, modifiedRows(0) {
    std::unique_lock<std::mutex> lock(connection.mutex);

    sqlite3_prepare_v2(
        this->connection->connection, sql, -1, &this->stmt, nullptr);
}